

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O3

void __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
::SortedSingleFileIndexedStorage
          (SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
           *this,vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
                 *newer,string *dataFileName,shared_ptr<supermap::io::FileManager> *fileManager,
          uint batchSize,InnerRegisterSupplier *registerSupplier)

{
  array<unsigned_char,_1UL> aVar1;
  array<unsigned_char,_1UL> aVar2;
  _Manager_type p_Var3;
  pointer pSVar4;
  pointer pSVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  pointer poVar9;
  int iVar10;
  uint uVar11;
  undefined8 uVar12;
  ulong uVar13;
  _Storage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true> _Var14;
  ulong uVar15;
  long lVar16;
  size_type sVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
  writeBuffer;
  vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
  frontLine;
  KeyValue<supermap::Key<1UL>,_unsigned_int> minItem;
  vector<unsigned_int,_std::allocator<unsigned_int>_> currentFrontPointers;
  _Storage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true> local_e8;
  _Storage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true> _Stack_e0;
  long local_d8;
  size_type local_d0;
  uint local_c4;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
  *local_c0;
  vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
  local_b8;
  ulong local_a0;
  KeyValue<supermap::Key<1UL>,_unsigned_int> local_98;
  path local_90;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type local_50;
  shared_ptr<supermap::io::FileManager> local_48;
  
  local_c4 = batchSize;
  std::filesystem::__cxx11::path::path(&local_90,dataFileName,auto_format);
  local_48.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_48.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_58 = (_Manager_type)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = registerSupplier->_M_invoker;
  p_Var3 = (registerSupplier->super__Function_base)._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    local_68._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(registerSupplier->super__Function_base)._M_functor;
    local_68._8_8_ = *(undefined8 *)((long)&(registerSupplier->super__Function_base)._M_functor + 8)
    ;
    (registerSupplier->super__Function_base)._M_manager = (_Manager_type)0x0;
    registerSupplier->_M_invoker = (_Invoker_type)0x0;
    local_58 = p_Var3;
  }
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
  ::SingleFileIndexedStorage
            (&this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
             ,&local_90,&local_48,(InnerRegisterSupplier *)&local_68);
  if (local_58 != (_Manager_type)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (local_48.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::filesystem::__cxx11::path::~path(&local_90);
  (this->
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
  ).super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>.
  super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>.
  _vptr_OrderedStorage = (_func_int **)&PTR_append_001ff580;
  (this->super_Findable<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_supermap::Key<1UL>_>).
  _vptr_Findable = (_func_int **)&DAT_001ff5c8;
  pSVar4 = (newer->
           super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pSVar5 = (newer->
           super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  sVar17 = ((long)pSVar5 - (long)pSVar4 >> 3) * 0x6db6db6db6db6db7;
  local_c0 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,sVar17,
             (allocator_type *)&local_b8);
  _Stack_e0._M_value = _Stack_e0._M_value & 0xffffffffffffff00;
  std::
  vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
  ::vector(&local_b8,sVar17,(value_type *)&local_e8._M_value,(allocator_type *)&local_98);
  if (pSVar5 == pSVar4) {
    lVar16 = 0;
    local_d0 = sVar17;
  }
  else {
    lVar20 = sVar17 + (sVar17 == 0);
    lVar18 = 8;
    lVar19 = 0;
    lVar16 = 0;
    local_d0 = sVar17;
    do {
      pSVar4 = (newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      iVar10 = (**(code **)(*(long *)((long)&(pSVar4->
                                             super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                             ).
                                             super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                             .
                                             super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                             ._vptr_OrderedStorage + lVar19) + 8))
                         ((long)&(pSVar4->
                                 super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                 ).
                                 super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                 .
                                 super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                 ._vptr_OrderedStorage + lVar19);
      poVar9 = local_b8.
               super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (iVar10 != 0) {
        pSVar4 = (newer->
                 super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar12 = (**(code **)(*(long *)((long)&(pSVar4->
                                               super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                               ).
                                               super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                               .
                                               super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                               ._vptr_OrderedStorage + lVar19) + 0x20))
                           ((long)&(pSVar4->
                                   super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                   ).
                                   super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                   .
                                   super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                   ._vptr_OrderedStorage + lVar19,0);
        if (*(char *)((long)&(poVar9->
                             super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>
                             ._M_payload + lVar18) == '\x01') {
          *(undefined1 *)
           ((long)&(poVar9->
                   super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true,_true>
                   )._M_payload.
                   super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>
                   ._M_payload + lVar18) = 0;
        }
        *(undefined8 *)((long)poVar9 + lVar18 + -8) = uVar12;
        *(undefined1 *)
         ((long)&(poVar9->
                 super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>
                 ._M_payload + lVar18) = 1;
        pSVar4 = (newer->
                 super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar11 = (**(code **)(*(long *)((long)&(pSVar4->
                                               super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                               ).
                                               super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                               .
                                               super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                               ._vptr_OrderedStorage + lVar19) + 8))
                           ((long)&(pSVar4->
                                   super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                   ).
                                   super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                   .
                                   super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                   ._vptr_OrderedStorage + lVar19);
        lVar16 = lVar16 + (ulong)uVar11;
      }
      lVar19 = lVar19 + 0x38;
      lVar18 = lVar18 + 0xc;
      lVar20 = lVar20 + -1;
    } while (lVar20 != 0);
  }
  (*(this->
    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
    ).super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
    .super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>.
    register_.
    super_StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_supermap::CountingStorageInfo<unsigned_int,_void>_>
    .
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_supermap::CountingStorageInfo<unsigned_int,_void>_>_>
    ._vptr_Cloneable[5])
            (&(this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
              .register_,lVar16);
  local_e8 = (_Storage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true>)0x0;
  _Stack_e0 = (_Storage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true>)0x0;
  local_d8 = 0;
  local_a0 = (ulong)local_c4;
  std::
  vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
  ::reserve((vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
             *)&local_e8._M_value,local_a0);
  uVar11 = (int)local_d0 - 1;
  local_d0 = (size_type)uVar11;
  if (-1 < (int)uVar11) {
    uVar15 = 0;
    sVar17 = local_d0;
    bVar8 = false;
    do {
      do {
        uVar13 = uVar15;
        bVar7 = bVar8;
        if ((local_b8.
             super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[sVar17].
             super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true,_true>.
             _M_payload.
             super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>.
             _M_engaged == true) && (uVar13 = sVar17, bVar7 = true, bVar8)) {
          if (local_b8.
              super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar15].
              super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>.
              _M_engaged == false) {
            std::__throw_bad_optional_access();
          }
          aVar1._M_elems[0] =
               (_Type)local_b8.
                      super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar15].
                      super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>
                      ._M_payload._M_value.key.super_array<unsigned_char,_1UL>._M_elems[0];
          aVar2._M_elems[0] =
               (_Type)local_b8.
                      super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[sVar17].
                      super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>
                      ._M_payload._M_value.key.super_array<unsigned_char,_1UL>._M_elems[0];
          bVar7 = bVar8;
          if (((byte)aVar1._M_elems[0] <= (byte)aVar2._M_elems[0]) &&
             (uVar13 = uVar15, aVar2._M_elems[0] == aVar1._M_elems[0])) {
            iVar10 = *(int *)(local_90._M_pathname._M_dataplus._M_p + sVar17 * 4);
            *(uint *)(local_90._M_pathname._M_dataplus._M_p + sVar17 * 4) = iVar10 + 1U;
            pSVar4 = (newer->
                     super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar11 = (**(code **)(*(long *)&pSVar4[sVar17].
                                            super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                            .
                                            super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                            .
                                            super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                 + 8))(pSVar4 + sVar17);
            poVar9 = local_b8.
                     super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (iVar10 + 1U < uVar11) {
              pSVar4 = (newer->
                       super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              _Var14 = (_Storage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true>)
                       (**(code **)(*(long *)&pSVar4[sVar17].
                                              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                              .
                                              super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                              .
                                              super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                   + 0x20))
                                 (pSVar4 + sVar17,
                                  *(undefined4 *)
                                   (local_90._M_pathname._M_dataplus._M_p + sVar17 * 4));
              poVar9[sVar17].
              super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>.
              _M_payload = _Var14;
              poVar9[sVar17].
              super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>.
              _M_engaged = true;
              this = local_c0;
            }
            else {
              this = local_c0;
              if (local_b8.
                  super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[sVar17].
                  super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>
                  ._M_engaged == true) {
                local_b8.
                super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[sVar17].
                super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>.
                _M_engaged = false;
              }
            }
          }
        }
        bVar6 = 0 < (long)sVar17;
        uVar15 = uVar13;
        sVar17 = sVar17 - 1;
        bVar8 = bVar7;
      } while (bVar6);
      if (!bVar7) break;
      if (local_b8.
          super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar13].
          super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>.
          _M_engaged == false) {
        std::__throw_bad_optional_access();
      }
      local_98 = *(KeyValue<supermap::Key<1UL>,_unsigned_int> *)
                  (local_b8.
                   super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar13);
      lVar16 = (long)(int)uVar13;
      iVar10 = *(int *)(local_90._M_pathname._M_dataplus._M_p + lVar16 * 4);
      *(uint *)(local_90._M_pathname._M_dataplus._M_p + lVar16 * 4) = iVar10 + 1U;
      pSVar4 = (newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar11 = (**(code **)(*(long *)&pSVar4[lVar16].
                                      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                      .
                                      super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                      .
                                      super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                           + 8))(pSVar4 + lVar16);
      poVar9 = local_b8.
               super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (iVar10 + 1U < uVar11) {
        pSVar4 = (newer->
                 super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        _Var14 = (_Storage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true>)
                 (**(code **)(*(long *)&pSVar4[lVar16].
                                        super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                        .
                                        super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                        .
                                        super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                             + 0x20))
                           (pSVar4 + lVar16,
                            *(undefined4 *)(local_90._M_pathname._M_dataplus._M_p + lVar16 * 4));
        poVar9[lVar16].
        super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>.
        _M_payload = _Var14;
        poVar9[lVar16].
        super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>.
        _M_engaged = true;
      }
      else if (local_b8.
               super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar16].
               super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>.
               _M_engaged == true) {
        local_b8.
        super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar16].
        super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>.
        _M_engaged = false;
      }
      sVar17 = local_d0;
      std::
      vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>>
      ::emplace_back<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>
                ((vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>>
                  *)&local_e8._M_value,&local_98);
      if (local_c4 <= (uint)((ulong)((long)_Stack_e0 - (long)local_e8) >> 3)) {
        SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,unsigned_int,void>
        ::
        appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>*,std::vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>>>,supermap::SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,unsigned_int,void>::appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>*,std::vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>>>,void>(__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>*,std::vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>>>,__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>*,std::vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>>>)::_lambda(auto:1)_1_,supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,void>
                  ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,unsigned_int,void>
                    *)this);
        if (_Stack_e0 != local_e8) {
          _Stack_e0 = local_e8;
        }
        std::
        vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
        ::reserve((vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
                   *)&local_e8._M_value,local_a0);
      }
      bVar8 = false;
      uVar15 = 0;
    } while (-1 < (int)sVar17);
  }
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,unsigned_int,void>::
  appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>*,std::vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>>>,supermap::SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,unsigned_int,void>::appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>*,std::vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>>>,void>(__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>*,std::vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>>>,__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>*,std::vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>>>)::_lambda(auto:1)_1_,supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,void>
            ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,unsigned_int,void>
              *)this,local_e8,_Stack_e0);
  if (_Stack_e0 != local_e8) {
    _Stack_e0 = local_e8;
  }
  std::
  vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
  ::reserve((vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
             *)&local_e8._M_value,local_a0);
  if (local_e8 != (_Storage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true>)0x0) {
    operator_delete((void *)local_e8,local_d8 - (long)local_e8);
  }
  if (local_b8.
      super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90._M_pathname._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_90._M_pathname._M_dataplus._M_p,
                    local_90._M_pathname.field_2._M_allocated_capacity -
                    (long)local_90._M_pathname._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit SortedSingleFileIndexedStorage(
        const std::vector<SortedSingleFileIndexedStorage<T, IndexT, RegisterInfo, FindPattern>> &newer,
        std::string dataFileName,
        std::shared_ptr<io::FileManager> fileManager,
        IndexT batchSize,
        InnerRegisterSupplier registerSupplier
    ) : SingleFileIndexedStorage<T, IndexT, RegisterInfo>(
        std::move(dataFileName),
        std::move(fileManager),
        std::move(registerSupplier)
    ) {
        const std::size_t storagesCount = newer.size();
        std::vector<IndexT> currentFrontPointers(storagesCount);
        std::vector<std::optional<T>> frontLine(storagesCount, std::nullopt);
        std::uint64_t totalSize = 0;
        for (std::size_t i = 0; i < storagesCount; ++i) {
            if (newer[i].getItemsCount() > 0) {
                frontLine[i].emplace(newer[i].get(0));
                totalSize += newer[i].getItemsCount();
            }
        }
        getRegister().reserve(totalSize);
        auto updateOnce = [&](std::int32_t i) {
            if (++currentFrontPointers[i] < newer[i].getItemsCount()) {
                frontLine[i].emplace(newer[i].get(currentFrontPointers[i]));
            } else {
                frontLine[i].reset();
            }
        };

        std::vector<T> writeBuffer;
        writeBuffer.reserve(batchSize);

        auto dropWriteBuffer = [&]() {
            appendAll(writeBuffer.begin(), writeBuffer.end());
            writeBuffer.clear();
            writeBuffer.reserve(batchSize);
        };

        while (true) {
            std::size_t min = 0;
            bool hasMin = false;
            for (std::int32_t i = storagesCount - 1; i >= 0; --i) {
                if (!frontLine[i].has_value()) {
                    continue;
                }
                if (!hasMin) {
                    hasMin = true;
                    min = i;
                    continue;
                }
                if (frontLine[i].value() < frontLine[min].value()) {
                    min = i;
                } else if (frontLine[i].value() == frontLine[min].value()) {
                    updateOnce(i);
                }
            }
            if (!hasMin) {
                break;
            }
            T minItem = frontLine[min].value();
            updateOnce(min);
            writeBuffer.push_back(std::move(minItem));
            if (static_cast<IndexT>(writeBuffer.size()) >= batchSize) {
                dropWriteBuffer();
            }
        }
        dropWriteBuffer();
    }